

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

hugeint_t __thiscall
duckdb::DecimalScaleUpOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
          (DecimalScaleUpOperator *this,hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  hugeint_t hVar3;
  hugeint_t input_00;
  hugeint_t result;
  string local_58;
  hugeint_t local_38;
  
  hVar3.upper = input.lower;
  iVar2 = 0;
  hVar3.lower = (uint64_t)this;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar3,&local_38,false);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)local_38.lower;
    local_58._M_string_length = local_38.upper;
    hVar3 = hugeint_t::operator*((hugeint_t *)&local_58,(hugeint_t *)(idx + 0x30));
    return hVar3;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar2;
  input_00.lower = hVar3.upper;
  CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_58,(duckdb *)this,input_00);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}